

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O3

uint quarticSolver(double *ce,double *roots)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  uint i;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double croots [3];
  double cubic [3];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  double local_68 [4];
  double local_48 [3];
  
  dVar9 = *ce;
  dVar14 = dVar9 * 0.25;
  dVar11 = ce[1];
  dVar8 = dVar9 * dVar9 * -0.375 + dVar11;
  dVar10 = (dVar9 * dVar9 * 0.125 + dVar11 * -0.5) * dVar9 + ce[2];
  uStack_c0 = SUB84(dVar10,0);
  uStack_bc = (undefined4)((ulong)dVar10 >> 0x20);
  dVar11 = (dVar14 * dVar14 * -3.0 + dVar11) * dVar14 * dVar14 + (ce[3] - ce[2] * dVar14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"quarticSolver:: p=",0x12);
  poVar5 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tq=",3);
  auVar3._8_4_ = uStack_c0;
  auVar3._0_8_ = dVar8;
  auVar3._12_4_ = uStack_bc;
  dVar9 = auVar3._8_8_;
  poVar5 = std::ostream::_M_insert<double>(dVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tr=",3);
  poVar5 = std::ostream::_M_insert<double>(dVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (ABS(dVar9) <= 1e-75) {
    dVar11 = dVar8 * 0.25 * dVar8 - dVar11;
    if (dVar11 < 0.0) {
      return 0;
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar11 = dVar8 * -0.5 - dVar11;
    dVar9 = -dVar8 - dVar11;
    if (0.0 <= dVar11) {
      dVar10 = SQRT(dVar11);
      dVar8 = dVar10;
      if (0.0 > dVar11) {
        dVar8 = sqrt(dVar11);
      }
      *roots = dVar8 - dVar14;
      if (dVar11 < 0.0) {
        dVar10 = sqrt(dVar11);
      }
      roots[1] = -dVar10 - dVar14;
      dVar8 = SQRT(dVar9);
      dVar11 = dVar8;
      if (dVar9 < 0.0) {
        dVar11 = sqrt(dVar9);
      }
      roots[2] = dVar11 - dVar14;
      if (dVar9 < 0.0) {
        dVar8 = sqrt(dVar9);
      }
      roots[3] = -dVar8 - dVar14;
      return 4;
    }
    if (dVar9 < 0.0) {
      return 0;
    }
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    *roots = dVar9 - dVar14;
    roots[1] = -(dVar9 - dVar14) - dVar14;
  }
  else {
    if (ABS(dVar11) < 1e-75) {
      uVar7 = 0;
      local_48[0] = 0.0;
      *roots = 0.0;
      local_48[1] = dVar8;
      local_48[2] = dVar10;
      uVar4 = cubicSolver(local_48,roots + 1);
      do {
        roots[uVar7] = roots[uVar7] - dVar14;
        uVar7 = uVar7 + 1;
      } while (uVar4 + 1 != uVar7);
      return uVar4 + 1;
    }
    local_48[0] = dVar8 + dVar8;
    local_48[1] = dVar8 * dVar8 + dVar11 * -4.0;
    local_48[2] = -dVar9 * dVar9;
    uVar4 = cubicSolver(local_48,local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"quarticSolver:: real roots from cubic: ",0x27);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cubic[",6);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]=",2);
      poVar5 = std::ostream::_M_insert<double>(local_48[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," x= ",4);
      poVar5 = std::ostream::_M_insert<double>(local_68[uVar7]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    if (uVar4 != 1) {
      if (local_68[0] <= 0.0) {
        return 0;
      }
      if (0.0 < local_68[1]) {
        if (local_68[0] < 0.0) {
          dVar11 = sqrt(local_68[0]);
        }
        else {
          dVar11 = SQRT(local_68[0]);
        }
        dVar12 = (dVar9 * 0.5) / dVar11;
        dVar10 = dVar11 * 0.25 * dVar11;
        dVar9 = dVar10 - ((local_68[0] + dVar8) * 0.5 + dVar12);
        if (0.0 <= dVar9) {
          if (dVar9 < 0.0) {
            dVar9 = sqrt(dVar9);
          }
          else {
            dVar9 = SQRT(dVar9);
          }
          dVar9 = -dVar11 * -0.5 + dVar9;
          *roots = dVar9;
          roots[1] = dVar11 - dVar9;
        }
        dVar10 = dVar10 - ((local_68[0] + dVar8) * 0.5 - dVar12);
        if (0.0 <= dVar10) {
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          dVar10 = dVar11 * -0.5 + dVar10;
          roots[2] = dVar10;
          roots[3] = -dVar11 - dVar10;
        }
        lVar6 = 0;
        do {
          dVar9 = (roots + lVar6)[1] - dVar14;
          auVar2._8_4_ = SUB84(dVar9,0);
          auVar2._0_8_ = roots[lVar6] - dVar14;
          auVar2._12_4_ = (int)((ulong)dVar9 >> 0x20);
          *(undefined1 (*) [16])(roots + lVar6) = auVar2;
          lVar6 = lVar6 + 2;
        } while (lVar6 != 4);
        return 4;
      }
      return 0;
    }
    if (local_68[0] < 0.0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Quartic Error:: Found one real root for cubic, but negative\n",0x3c);
      return 0;
    }
    if (local_68[0] < 0.0) {
      dVar11 = sqrt(local_68[0]);
    }
    else {
      dVar11 = SQRT(local_68[0]);
    }
    dVar13 = (dVar9 * 0.5) / dVar11;
    dVar12 = dVar11 * 0.25 * dVar11;
    dVar9 = dVar12 - ((local_68[0] + dVar8) * 0.5 + dVar13);
    dVar10 = -dVar11;
    if ((0.0 <= dVar9) ||
       (dVar9 = dVar12 - ((local_68[0] + dVar8) * 0.5 - dVar13), dVar10 = dVar11, dVar11 = -dVar11,
       0.0 <= dVar9)) {
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar9 = dVar10 * -0.5 + dVar9;
      *roots = dVar9;
      roots[1] = dVar11 - dVar9;
    }
    auVar1._8_4_ = SUB84(roots[1] - dVar14,0);
    auVar1._0_8_ = *roots - dVar14;
    auVar1._12_4_ = (int)((ulong)(roots[1] - dVar14) >> 0x20);
    *(undefined1 (*) [16])roots = auVar1;
  }
  return 2;
}

Assistant:

unsigned int quarticSolver(double * ce, double *roots)
//quartic solver
// x^4 + ce[0] x^3 + ce[1] x^2 + ce[2] x + ce[3] = 0
{
    // x^4 + a x^3 + b x^2 +c x + d = 0
    // depressed quartic, x= t - a/4
    // t^4 + ( b - 3/8 a^2 ) t^2 + (c - a b/2 + a^3/8) t + d - a c /4 + a^2 b/16 - 3 a^4/256 =0
    // t^4 + p t^2 + q t + r =0
    // p= b - (3./8)*a*a;
    // q= c - 0.5*a*b+(1./8)*a*a*a;
    // r= d - 0.25*a*c+(1./16)*a*a*b-(3./256)*a^4
    unsigned int ret=0;
    double shift=0.25*ce[0];
    double shift2=shift*shift;
    double a2=ce[0]*ce[0];
    double p= ce[1] - (3./8)*a2;
    double q= ce[2] + ce[0]*((1./8)*a2 - 0.5*ce[1]);
    double r= ce[3] - shift*ce[2] + (ce[1] - 3.*shift2)*shift2;
    std::cout<<"quarticSolver:: p="<<p<<"\tq="<<q<<"\tr="<<r<<std::endl;
    if (fabs(q) <= 1.0e-75) {// Biquadratic equations
        double discriminant= 0.25*p*p -r;
        if (discriminant < 0.) {
            return 0;
        }
        double t2[2];
        t2[0]=-0.5*p-sqrt(discriminant);
        t2[1]= -p - t2[0];
        if ( t2[0] >= 0. ) {// four real roots
            roots[0]=sqrt(t2[0])-shift;
            roots[1]= -sqrt(t2[0])-shift;
            roots[2]=sqrt(t2[1])-shift;
            roots[3]= -sqrt(t2[1])-shift;
            return 4;
        }
        if ( t2[1] >= 0.) { // two real roots
            roots[0]=sqrt(t2[1])-shift;
            roots[1]= -roots[0]-shift;
            return 2;
        }
        return 0;
    }
    if ( fabs(r)< 1.0e-75 ) {
        double cubic[3]= {0.,p,q};
        roots[0]=0.;
        ret=1+cubicSolver(cubic,roots+1);
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    // depressed quartic to two quadratic equations
    // t^4 + p t^2 + q t + r = ( t^2 + u t + v) ( t^2 - u t + w)
    // so,
    // 	p + u^2= w+v
    // 	q/u= w-v
    // 	r= wv
    // so,
    //  (p+u^2)^2 - (q/u)^2 = 4 r
    //  y=u^2,
    //  y^3 + 2 p y^2 + ( p^2 - 4 r) y - q^2 =0
    //
    double cubic[3]= {2.*p,p*p-4.*r,-q*q},croots[3];
    ret = cubicSolver(cubic,croots);
    std::cout<<"quarticSolver:: real roots from cubic: "<<ret<<std::endl;
    for(unsigned int i=0; i<ret; i++)
        std::cout<<"cubic["<<i<<"]="<<cubic[i]<<" x= "<<croots[i]<<std::endl;
    if (ret==1) { //one real root from cubic
        if (croots[0]< 0.) {//this should not happen
            std::cerr<<"Quartic Error:: Found one real root for cubic, but negative\n";
            return 0;
        }
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        if (! ret ) {
            ce2[0]=	sqrtz0;
            ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
            ret=quadraticSolver(ce2,roots);
        }
        ret=2;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    if ( croots[0]> 0. && croots[1] > 0. ) {
        double sqrtz0=sqrt(croots[0]);
        double ce2[2];
        ce2[0]=	-sqrtz0;
        ce2[1]=0.5*(p+croots[0])+0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots);
        ce2[0]=	sqrtz0;
        ce2[1]=0.5*(p+croots[0])-0.5*q/sqrtz0;
        ret=quadraticSolver(ce2,roots+2);
        ret=4;
        for(unsigned int i=0; i<ret; i++) roots[i] -= shift;
        return ret;
    }
    return 0;



}